

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O3

void ColorTracker::showImg(Mat *img)

{
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  _InputArray local_30;
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"showImg","");
  local_30.sz.width = 0;
  local_30.sz.height = 0;
  local_30.flags = 0x1010000;
  local_30.obj = img;
  cv::imshow((string *)local_50,&local_30);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  return;
}

Assistant:

void ColorTracker::showImg(const Mat& img){
    cv::imshow("showImg",img);
    cv::waitKey(0);
    cv::destroyAllWindows();
}